

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directional_light.cpp
# Opt level: O0

Light_EvalRes *
embree::DirectionalLight_eval(Light *super,DifferentialGeometry *param_2,Vec3fa *dir)

{
  undefined8 *in_RCX;
  long in_RSI;
  Light_EvalRes *in_RDI;
  float fVar1;
  DirectionalLight *self;
  Light_EvalRes *res;
  vfloat4 c;
  vfloat4 b;
  vfloat4 a;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  
  Light_EvalRes::Light_EvalRes(in_RDI);
  fVar1 = std::numeric_limits<float>::infinity();
  in_RDI->dist = fVar1;
  if (*(float *)(in_RSI + 0x50) <= 0.9999999 && *(float *)(in_RSI + 0x50) != 0.9999999) {
    local_a8 = (float)*(undefined8 *)(in_RSI + 0x30);
    fStack_a4 = (float)((ulong)*(undefined8 *)(in_RSI + 0x30) >> 0x20);
    fStack_a0 = (float)*(undefined8 *)(in_RSI + 0x38);
    local_b8 = (float)*in_RCX;
    fStack_b4 = (float)((ulong)*in_RCX >> 0x20);
    fStack_b0 = (float)in_RCX[1];
    fVar1 = local_a8 * local_b8 + fStack_a4 * fStack_b4 + fStack_a0 * fStack_b0;
    if (*(float *)(in_RSI + 0x50) <= fVar1 && fVar1 != *(float *)(in_RSI + 0x50)) {
      fVar1 = *(float *)(in_RSI + 0x54);
      local_88 = (float)*(undefined8 *)(in_RSI + 0x40);
      fStack_84 = (float)((ulong)*(undefined8 *)(in_RSI + 0x40) >> 0x20);
      fStack_80 = (float)*(undefined8 *)(in_RSI + 0x48);
      fStack_7c = (float)((ulong)*(undefined8 *)(in_RSI + 0x48) >> 0x20);
      *(ulong *)&(in_RDI->value).field_0 = CONCAT44(fStack_84 * fVar1,local_88 * fVar1);
      *(ulong *)((long)&(in_RDI->value).field_0 + 8) = CONCAT44(fStack_7c * fVar1,fStack_80 * fVar1)
      ;
      in_RDI->pdf = *(float *)(in_RSI + 0x54);
      return in_RDI;
    }
  }
  *(undefined8 *)&(in_RDI->value).field_0 = 0;
  *(undefined8 *)((long)&(in_RDI->value).field_0 + 8) = 0;
  in_RDI->pdf = 0.0;
  return in_RDI;
}

Assistant:

SYCL_EXTERNAL Light_EvalRes DirectionalLight_eval(const Light* super,
                                                                 const DifferentialGeometry&,
                                                                 const Vec3fa& dir)
{
  DirectionalLight* self = (DirectionalLight*)super;
  Light_EvalRes res;
  res.dist = inf;

  if (self->cosAngle < COS_ANGLE_MAX && dot(self->frame.vz, dir) > self->cosAngle) {
    res.value = self->radiance * self->pdf;
    res.pdf = self->pdf;
  } else {
    res.value = Vec3fa(0.f);
    res.pdf = 0.f;
  }

  return res;
}